

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int g_read(lua_State *L,FILE *f,int first)

{
  char cVar1;
  int iVar2;
  size_t n_00;
  char *pcVar3;
  int local_48;
  char *p;
  size_t l;
  int n;
  int success;
  int nargs;
  int first_local;
  FILE *f_local;
  lua_State *L_local;
  
  iVar2 = lua_gettop(L);
  clearerr((FILE *)f);
  if (iVar2 + -1 == 0) {
    l._4_4_ = read_line(L,f);
    l._0_4_ = first + 1;
  }
  else {
    luaL_checkstack(L,iVar2 + 0x13,"too many arguments");
    l._4_4_ = 1;
    l._0_4_ = first;
    n = iVar2 + -1;
    while (n != 0 && l._4_4_ != 0) {
      iVar2 = lua_type(L,(int)l);
      if (iVar2 == 3) {
        n_00 = lua_tointeger(L,(int)l);
        if (n_00 == 0) {
          local_48 = test_eof(L,f);
        }
        else {
          local_48 = read_chars(L,f,n_00);
        }
        l._4_4_ = local_48;
      }
      else {
        pcVar3 = lua_tolstring(L,(int)l,(size_t *)0x0);
        if ((pcVar3 == (char *)0x0) || (*pcVar3 != '*')) {
          luaL_argerror(L,(int)l,"invalid option");
        }
        cVar1 = pcVar3[1];
        if (cVar1 == 'a') {
          read_chars(L,f,0xffffffffffffffff);
          l._4_4_ = 1;
        }
        else if (cVar1 == 'l') {
          l._4_4_ = read_line(L,f);
        }
        else {
          if (cVar1 != 'n') {
            iVar2 = luaL_argerror(L,(int)l,"invalid format");
            return iVar2;
          }
          l._4_4_ = read_number(L,f);
        }
      }
      l._0_4_ = (int)l + 1;
      n = n + -1;
    }
  }
  iVar2 = ferror((FILE *)f);
  if (iVar2 == 0) {
    if (l._4_4_ == 0) {
      lua_settop(L,-2);
      lua_pushnil(L);
    }
    L_local._4_4_ = (int)l - first;
  }
  else {
    L_local._4_4_ = pushresult(L,0,(char *)0x0);
  }
  return L_local._4_4_;
}

Assistant:

static int g_read(lua_State*L,FILE*f,int first){
int nargs=lua_gettop(L)-1;
int success;
int n;
clearerr(f);
if(nargs==0){
success=read_line(L,f);
n=first+1;
}
else{
luaL_checkstack(L,nargs+20,"too many arguments");
success=1;
for(n=first;nargs--&&success;n++){
if(lua_type(L,n)==3){
size_t l=(size_t)lua_tointeger(L,n);
success=(l==0)?test_eof(L,f):read_chars(L,f,l);
}
else{
const char*p=lua_tostring(L,n);
luaL_argcheck(L,p&&p[0]=='*',n,"invalid option");
switch(p[1]){
case'n':
success=read_number(L,f);
break;
case'l':
success=read_line(L,f);
break;
case'a':
read_chars(L,f,~((size_t)0));
success=1;
break;
default:
return luaL_argerror(L,n,"invalid format");
}
}
}
}
if(ferror(f))
return pushresult(L,0,NULL);
if(!success){
lua_pop(L,1);
lua_pushnil(L);
}
return n-first;
}